

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getPressure(Thermo *this)

{
  Snapshot *this_00;
  RealType RVar1;
  undefined8 uVar2;
  long lVar3;
  Mat3x3d tensor;
  double local_98 [9];
  Mat3x3d local_50;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasPressure == false) {
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[8] = 0.0;
    getPressureTensor(&local_50,this);
    lVar3 = 0;
    do {
      *(undefined8 *)((long)local_98 + lVar3 + 0x10) =
           *(undefined8 *)
            ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar3 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar3 + 8);
      *(undefined8 *)((long)local_98 + lVar3) =
           *(undefined8 *)
            ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar3);
      *(undefined8 *)((long)local_98 + lVar3 + 8) = uVar2;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
    Snapshot::setPressure(this_00,((local_98[0] + local_98[4] + local_98[8]) * 163882576.0) / 3.0);
  }
  RVar1 = Snapshot::getPressure(this_00);
  return RVar1;
}

Assistant:

RealType Thermo::getPressure() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasPressure) {
      // Relies on the calculation of the full molecular pressure tensor

      Mat3x3d tensor;
      RealType pressure;

      tensor = getPressureTensor();

      pressure = Constants::pressureConvert *
                 (tensor(0, 0) + tensor(1, 1) + tensor(2, 2)) / 3.0;

      snap->setPressure(pressure);
    }

    return snap->getPressure();
  }